

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

PyTypeObject * pybind11::detail::make_static_property_type(void)

{
  int iVar1;
  handle hVar2;
  PyTypeObject *pPVar3;
  error_already_set *this;
  object name_obj;
  object local_28;
  object local_20;
  
  hVar2.m_ptr = (PyObject *)PyUnicode_FromString("pybind11_static_property");
  local_20.super_handle.m_ptr = (handle)(handle)hVar2.m_ptr;
  pPVar3 = (PyTypeObject *)(*_PySequence_Check)(&PyType_Type,0);
  if (pPVar3 == (PyTypeObject *)0x0) {
    pybind11_fail("make_static_property_type(): error allocating type!");
  }
  if (hVar2.m_ptr != (PyObject *)0x0) {
    (hVar2.m_ptr)->ob_refcnt = (hVar2.m_ptr)->ob_refcnt + 2;
  }
  pPVar3[2].tp_basicsize = (Py_ssize_t)hVar2.m_ptr;
  pPVar3[2].tp_dealloc = (destructor)hVar2.m_ptr;
  pPVar3->tp_name = "pybind11_static_property";
  _PyProperty_Type = _PyProperty_Type + 1;
  pPVar3->tp_base = (_typeobject *)&PyProperty_Type;
  pPVar3->tp_flags = 0x600;
  pPVar3->tp_descr_get = pybind11_static_get;
  pPVar3->tp_descr_set = pybind11_static_set;
  iVar1 = PyType_Ready(pPVar3);
  if (-1 < iVar1) {
    str::str((str *)&local_28,"pybind11_builtins");
    iVar1 = PyObject_SetAttrString(pPVar3,"__module__",local_28.super_handle.m_ptr);
    if (iVar1 == 0) {
      object::~object(&local_28);
      object::~object(&local_20);
      return pPVar3;
    }
    this = (error_already_set *)__cxa_allocate_exception(0x28);
    error_already_set::error_already_set(this);
    __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
  }
  pybind11_fail("make_static_property_type(): failure in PyType_Ready()!");
}

Assistant:

inline PyTypeObject *make_static_property_type() {
    constexpr auto *name = "pybind11_static_property";
    auto name_obj = reinterpret_steal<object>(PYBIND11_FROM_STRING(name));

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto heap_type = (PyHeapTypeObject *) PyType_Type.tp_alloc(&PyType_Type, 0);
    if (!heap_type)
        pybind11_fail("make_static_property_type(): error allocating type!");

    heap_type->ht_name = name_obj.inc_ref().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = name_obj.inc_ref().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = name;
    type->tp_base = type_incref(&PyProperty_Type);
    type->tp_flags = Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;
    type->tp_descr_get = pybind11_static_get;
    type->tp_descr_set = pybind11_static_set;

    if (PyType_Ready(type) < 0)
        pybind11_fail("make_static_property_type(): failure in PyType_Ready()!");

    setattr((PyObject *) type, "__module__", str("pybind11_builtins"));
    PYBIND11_SET_OLDPY_QUALNAME(type, name_obj);

    return type;
}